

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type-shape.cpp
# Opt level: O0

Comparison __thiscall
wasm::anon_unknown_0::
RecGroupComparator<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-type-shape.cpp:320:29)>
::compare(RecGroupComparator<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_wasm_wasm_type_shape_cpp:320:29)>
          *this,HeapType a,HeapType b)

{
  uint uVar1;
  bool bVar2;
  bool bVar3;
  TypeID TVar4;
  TypeID TVar5;
  pointer ppVar6;
  uint indexB;
  uint indexA;
  undefined1 local_49;
  _Node_iterator_base<std::pair<const_wasm::HeapType,_unsigned_int>,_true> _Stack_48;
  bool foundB;
  byte local_39;
  _Node_iterator_base<std::pair<const_wasm::HeapType,_unsigned_int>,_true> _Stack_38;
  bool foundA;
  iterator itB;
  iterator itA;
  RecGroupComparator<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_wasm_wasm_type_shape_cpp:320:29)>
  *this_local;
  HeapType b_local;
  HeapType a_local;
  
  this_local = (RecGroupComparator<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_wasm_wasm_type_shape_cpp:320:29)>
                *)b.id;
  b_local = a;
  bVar2 = HeapType::isBasic(&b_local);
  bVar3 = HeapType::isBasic((HeapType *)&this_local);
  if (bVar2 == bVar3) {
    bVar2 = HeapType::isBasic(&b_local);
    if (bVar2) {
      TVar4 = HeapType::getID(&b_local);
      TVar5 = HeapType::getID((HeapType *)&this_local);
      if (TVar4 == TVar5) {
        a_local.id._4_4_ = EQ;
      }
      else {
        TVar4 = HeapType::getID(&b_local);
        TVar5 = HeapType::getID((HeapType *)&this_local);
        a_local.id._4_4_ = GT;
        if (TVar4 < TVar5) {
          a_local.id._4_4_ = LT;
        }
      }
    }
    else {
      itB = std::
            unordered_map<wasm::HeapType,_unsigned_int,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>
            ::find(&this->indicesA,&b_local);
      _Stack_38._M_cur =
           (__node_type *)
           std::
           unordered_map<wasm::HeapType,_unsigned_int,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>
           ::find(&this->indicesB,(key_type *)&this_local);
      _Stack_48._M_cur =
           (__node_type *)
           std::
           unordered_map<wasm::HeapType,_unsigned_int,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>
           ::end(&this->indicesA);
      local_39 = std::__detail::operator!=
                           (&itB.
                             super__Node_iterator_base<std::pair<const_wasm::HeapType,_unsigned_int>,_true>
                            ,&stack0xffffffffffffffb8);
      _indexB = (__node_type *)
                std::
                unordered_map<wasm::HeapType,_unsigned_int,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>
                ::end(&this->indicesB);
      local_49 = std::__detail::operator!=
                           (&stack0xffffffffffffffc8,
                            (_Node_iterator_base<std::pair<const_wasm::HeapType,_unsigned_int>,_true>
                             *)&indexB);
      if ((local_39 & 1) == local_49) {
        if ((local_39 & 1) == 0) {
          a_local.id._4_4_ =
               anon_class_8_1_54a39801_for_compareTypes::operator()
                         (&this->compareTypes,b_local,(HeapType)this_local);
        }
        else {
          ppVar6 = std::__detail::
                   _Node_iterator<std::pair<const_wasm::HeapType,_unsigned_int>,_false,_true>::
                   operator->(&itB);
          uVar1 = ppVar6->second;
          ppVar6 = std::__detail::
                   _Node_iterator<std::pair<const_wasm::HeapType,_unsigned_int>,_false,_true>::
                   operator->((_Node_iterator<std::pair<const_wasm::HeapType,_unsigned_int>,_false,_true>
                               *)&stack0xffffffffffffffc8);
          if (uVar1 == ppVar6->second) {
            a_local.id._4_4_ = EQ;
          }
          else {
            a_local.id._4_4_ = GT;
            if (uVar1 < ppVar6->second) {
              a_local.id._4_4_ = LT;
            }
          }
        }
      }
      else {
        a_local.id._4_4_ = GT;
        if ((byte)local_49 < (local_39 & 1)) {
          a_local.id._4_4_ = LT;
        }
      }
    }
  }
  else {
    bVar2 = HeapType::isBasic((HeapType *)&this_local);
    bVar3 = HeapType::isBasic(&b_local);
    a_local.id._4_4_ = GT;
    if (bVar2 < bVar3) {
      a_local.id._4_4_ = LT;
    }
  }
  return a_local.id._4_4_;
}

Assistant:

Comparison compare(HeapType a, HeapType b) {
    if (a.isBasic() != b.isBasic()) {
      return b.isBasic() < a.isBasic() ? LT : GT;
    }
    if (a.isBasic()) {
      if (a.getID() != b.getID()) {
        return a.getID() < b.getID() ? LT : GT;
      }
      return EQ;
    }
    auto itA = indicesA.find(a);
    auto itB = indicesB.find(b);
    bool foundA = itA != indicesA.end();
    bool foundB = itB != indicesB.end();
    if (foundA != foundB) {
      return foundB < foundA ? LT : GT;
    }
    if (foundA) {
      auto indexA = itA->second;
      auto indexB = itB->second;
      if (indexA != indexB) {
        return indexA < indexB ? LT : GT;
      }
      return EQ;
    }
    // These types are external to the group, so fall back to the provided
    // comparator.
    return compareTypes(a, b);
  }